

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptional.cxx
# Opt level: O0

bool operator<=(EventLogger *lhs,EventLogger *rhs)

{
  value_type local_38;
  EventLogger *local_18;
  EventLogger *rhs_local;
  EventLogger *lhs_local;
  
  local_38.Type = COMPARE_EE_LE;
  local_38.Value = lhs->Value;
  local_38.Logger1 = lhs;
  local_38.Logger2 = rhs;
  local_18 = rhs;
  rhs_local = lhs;
  std::vector<Event,_std::allocator<Event>_>::push_back(&events,&local_38);
  return rhs_local->Value <= local_18->Value;
}

Assistant:

static bool operator<=(const EventLogger& lhs, const EventLogger& rhs)
{
  events.push_back({ Event::COMPARE_EE_LE, &lhs, &rhs, lhs.Value });
  return lhs.Value <= rhs.Value;
}